

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O3

string * tinyusdz::removeSuffix(string *__return_storage_ptr__,string *str,string *suffix)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = str->_M_string_length;
  if (suffix->_M_string_length <= uVar3) {
    lVar2 = ::std::__cxx11::string::find
                      ((char *)str,(ulong)(suffix->_M_dataplus)._M_p,
                       uVar3 - suffix->_M_string_length);
    uVar3 = str->_M_string_length;
    if (lVar2 != -1) {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

inline std::string removeSuffix(const std::string &str,
                                const std::string &suffix) {
  if (endsWith(str, suffix)) {
    return str.substr(0, str.length() - suffix.length());
  }
  return str;
}